

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupPermFlop(Gia_Man_t *p,Vec_Int_t *vFfPerm)

{
  char *pcVar1;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *pVVar9;
  Gia_Obj_t *pGVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  
  if (vFfPerm->nSize != p->nRegs) {
    __assert_fail("Vec_IntSize(vFfPerm) == Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x35e,"Gia_Man_t *Gia_ManDupPermFlop(Gia_Man_t *, Vec_Int_t *)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar1);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar1);
  }
  p_00->pName = pcVar7;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar1);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar1);
  }
  p_00->pSpec = pcVar7;
  p->pObjs->Value = 0;
  uVar12 = (ulong)(uint)p->nRegs;
  pVVar9 = p->vCis;
  iVar4 = pVVar9->nSize;
  if (p->nRegs < iVar4) {
    lVar15 = 0;
    do {
      if (iVar4 <= lVar15) goto LAB_001db4ab;
      iVar4 = pVVar9->pArray[lVar15];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_001db48c;
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      pGVar8 = Gia_ManAppendObj(p_00);
      uVar12 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar12 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar12 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar10 = p_00->pObjs;
      if ((pGVar8 < pGVar10) || (pGVar10 + p_00->nObjs <= pGVar8)) goto LAB_001db4ca;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar10) >> 2) * -0x55555555);
      pGVar10 = p_00->pObjs;
      if ((pGVar8 < pGVar10) || (pGVar10 + p_00->nObjs <= pGVar8)) goto LAB_001db4ca;
      pGVar2[iVar4].Value = (int)((ulong)((long)pGVar8 - (long)pGVar10) >> 2) * 0x55555556;
      lVar15 = lVar15 + 1;
      uVar12 = (ulong)(uint)p->nRegs;
      pVVar9 = p->vCis;
      iVar4 = pVVar9->nSize;
    } while (lVar15 < iVar4 - p->nRegs);
  }
  if ((int)uVar12 < 1) {
    iVar4 = p->nObjs;
    if (iVar4 < 1) goto LAB_001db2eb;
  }
  else {
    iVar13 = pVVar9->nSize;
    lVar15 = 0;
    do {
      uVar12 = (ulong)(uint)(iVar13 - (int)uVar12) + lVar15;
      iVar4 = (int)uVar12;
      if ((iVar4 < 0) || (iVar13 <= iVar4)) goto LAB_001db4ab;
      if ((pVVar9->pArray[uVar12 & 0xffffffff] < 0) ||
         (iVar4 = p->nObjs, iVar4 <= pVVar9->pArray[uVar12 & 0xffffffff])) goto LAB_001db48c;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar10 = Gia_ManAppendObj(p_00);
      uVar12 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar12 | 0x9fffffff;
      *(ulong *)pGVar10 =
           uVar12 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar2 = p_00->pObjs;
      if ((pGVar10 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar10)) {
LAB_001db4ca:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar2) >> 2) * -0x55555555);
      pGVar2 = p_00->pObjs;
      if ((pGVar10 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar10)) goto LAB_001db4ca;
      if (vFfPerm->nSize <= lVar15) goto LAB_001db4ab;
      uVar5 = p->nRegs;
      uVar12 = (ulong)uVar5;
      if ((int)uVar5 <= vFfPerm->pArray[lVar15]) {
        __assert_fail("v < Gia_ManRegNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d6,"Gia_Obj_t *Gia_ManRo(Gia_Man_t *, int)");
      }
      pVVar9 = p->vCis;
      iVar13 = pVVar9->nSize;
      uVar11 = (iVar13 - uVar5) + vFfPerm->pArray[lVar15];
      if (((int)uVar11 < 0) || (iVar13 <= (int)uVar11)) goto LAB_001db4ab;
      iVar14 = pVVar9->pArray[uVar11];
      if (((long)iVar14 < 0) || (iVar4 = p->nObjs, iVar4 <= iVar14)) goto LAB_001db48c;
      p->pObjs[iVar14].Value = (int)((ulong)((long)pGVar10 - (long)pGVar2) >> 2) * 0x55555556;
      lVar15 = lVar15 + 1;
    } while (lVar15 < (int)uVar5);
  }
  lVar15 = 8;
  lVar16 = 0;
  do {
    pGVar2 = p->pObjs;
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    uVar12 = *(ulong *)((long)pGVar2 + lVar15 + -8);
    if ((uVar12 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar12) {
      uVar5 = *(uint *)((long)pGVar2 + lVar15 + (ulong)(uint)((int)(uVar12 & 0x1fffffff) << 2) * -3)
      ;
      if (((int)uVar5 < 0) ||
         (uVar11 = *(uint *)((long)pGVar2 +
                            lVar15 + (ulong)((uint)(uVar12 >> 0x1e) & 0x7ffffffc) * -3),
         (int)uVar11 < 0)) goto LAB_001db4e9;
      iVar4 = Gia_ManAppendAnd(p_00,uVar5 ^ (uint)(uVar12 >> 0x1d) & 1,
                               uVar11 ^ (uint)(uVar12 >> 0x3d) & 1);
      *(int *)(&pGVar2->field_0x0 + lVar15) = iVar4;
      iVar4 = p->nObjs;
    }
    lVar16 = lVar16 + 1;
    lVar15 = lVar15 + 0xc;
  } while (lVar16 < iVar4);
  uVar12 = (ulong)(uint)p->nRegs;
LAB_001db2eb:
  pVVar9 = p->vCos;
  iVar4 = pVVar9->nSize;
  if ((int)uVar12 < iVar4) {
    lVar15 = 0;
    do {
      if (iVar4 <= lVar15) goto LAB_001db4ab;
      iVar4 = pVVar9->pArray[lVar15];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_001db48c;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = p->pObjs + iVar4;
      if ((int)pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].Value < 0)
      goto LAB_001db4e9;
      uVar5 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar2 >> 0x1d & 1 ^
                                   pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].Value)
      ;
      pGVar2->Value = uVar5;
      lVar15 = lVar15 + 1;
      uVar12 = (ulong)(uint)p->nRegs;
      pVVar9 = p->vCos;
      iVar4 = pVVar9->nSize;
    } while (lVar15 < iVar4 - p->nRegs);
  }
  iVar4 = (int)uVar12;
  if (0 < iVar4) {
    lVar15 = 0;
    do {
      iVar13 = p->vCos->nSize;
      iVar4 = (int)uVar12;
      uVar12 = (ulong)(uint)(iVar13 - iVar4) + lVar15;
      iVar14 = (int)uVar12;
      if ((iVar14 < 0) || (iVar13 <= iVar14)) {
LAB_001db4ab:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar3 = p->vCos->pArray;
      iVar14 = piVar3[uVar12 & 0xffffffff];
      if (((long)iVar14 < 0) || (p->nObjs <= iVar14)) {
LAB_001db48c:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      if (vFfPerm->nSize <= lVar15) goto LAB_001db4ab;
      if (iVar4 <= vFfPerm->pArray[lVar15]) {
        __assert_fail("v < Gia_ManRegNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d7,"Gia_Obj_t *Gia_ManRi(Gia_Man_t *, int)");
      }
      uVar5 = vFfPerm->pArray[lVar15] + (iVar13 - iVar4);
      if (((int)uVar5 < 0) || (iVar13 <= (int)uVar5)) goto LAB_001db4ab;
      uVar5 = piVar3[uVar5];
      if (((long)(int)uVar5 < 0) || ((uint)p->nObjs <= uVar5)) goto LAB_001db48c;
      uVar11 = (uint)*(undefined8 *)(pGVar2 + (int)uVar5);
      uVar5 = (pGVar2 + (int)uVar5)[-(ulong)(uVar11 & 0x1fffffff)].Value;
      if ((int)uVar5 < 0) {
LAB_001db4e9:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar5 = Gia_ManAppendCo(p_00,uVar11 >> 0x1d & 1 ^ uVar5);
      pGVar2[iVar14].Value = uVar5;
      lVar15 = lVar15 + 1;
      iVar4 = p->nRegs;
      uVar12 = (ulong)iVar4;
    } while (lVar15 < (long)uVar12);
  }
  Gia_ManSetRegNum(p_00,iVar4);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupPermFlop( Gia_Man_t * p, Vec_Int_t * vFfPerm )
{
    //Vec_Int_t * vPermInv;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( Vec_IntSize(vFfPerm) == Gia_ManRegNum(p) );
    //vPermInv = Vec_IntInvert( vFfPerm, -1 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachRo( p, pObj, i )
        //Gia_ManRo(p, Vec_IntEntry(vPermInv, i))->Value = Gia_ManAppendCi(pNew);
        Gia_ManRo(p, Vec_IntEntry(vFfPerm, i))->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachRi( p, pObj, i )
        //pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy( Gia_ManRi(p, Vec_IntEntry(vPermInv, i)) ) );
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy( Gia_ManRi(p, Vec_IntEntry(vFfPerm, i)) ) );
    //Vec_IntFree( vPermInv );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}